

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olf.h
# Opt level: O2

void __thiscall
OLF<4U>::Check(OLF<4U> *this,HashMap<4U> *mp,
              vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              *outs)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  __node_base *p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM3_Qb;
  undefined1 auVar22 [16];
  
  p_Var16 = &(mp->_M_h)._M_before_begin;
  iVar12 = 0;
  iVar15 = 0;
  iVar14 = 0;
  while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
    iVar9 = (*(this->super_Abstract<4U>)._vptr_Abstract[2])(this,p_Var16 + 1);
    iVar3 = *(int *)((long)(p_Var16 + 1) + 4);
    iVar4 = (this->super_Abstract<4U>).HIT;
    if (iVar4 < iVar3) {
      iVar12 = iVar12 + 1;
      if (iVar4 < iVar9) {
        iVar15 = iVar15 + 1;
        iVar11 = iVar3 - iVar9;
        iVar13 = -iVar11;
        if (0 < iVar11) {
          iVar13 = iVar11;
        }
        auVar19._0_8_ = (double)iVar13;
        auVar19._8_8_ = in_XMM2_Qb;
        auVar17._0_8_ = auVar19._0_8_ / (double)iVar3;
        auVar17._8_8_ = in_XMM2_Qb;
        auVar6 = vunpcklpd_avx(auVar19,auVar17);
        (this->super_Abstract<4U>).aae = auVar6._0_8_ + (this->super_Abstract<4U>).aae;
        (this->super_Abstract<4U>).are = auVar6._8_8_ + (this->super_Abstract<4U>).are;
      }
    }
    iVar14 = iVar14 + (uint)(iVar4 < iVar9);
  }
  auVar18._0_8_ = (double)iVar15;
  auVar6._0_8_ = (this->super_Abstract<4U>).aae;
  auVar6._8_8_ = (this->super_Abstract<4U>).are;
  auVar18._8_8_ = auVar18._0_8_;
  auVar6 = vdivpd_avx(auVar6,auVar18);
  (this->super_Abstract<4U>).aae = (double)auVar6._0_8_;
  (this->super_Abstract<4U>).are = (double)auVar6._8_8_;
  auVar20._0_8_ = (double)iVar12;
  auVar20._8_8_ = in_XMM2_Qb;
  auVar22._0_8_ = (double)iVar14;
  auVar22._8_8_ = in_XMM3_Qb;
  auVar20 = vunpcklpd_avx(auVar22,auVar20);
  auVar20 = vdivpd_avx(auVar18,auVar20);
  (this->super_Abstract<4U>).pr = (double)auVar20._0_8_;
  (this->super_Abstract<4U>).cr = (double)auVar20._8_8_;
  auVar6 = vshufpd_avx(auVar6,auVar6,1);
  poVar10 = std::ostream::_M_insert<double>(auVar6._0_8_);
  std::operator<<(poVar10,",");
  poVar10 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).cr);
  std::operator<<(poVar10,",");
  poVar10 = std::ostream::_M_insert<double>((this->super_Abstract<4U>).pr);
  std::operator<<(poVar10,",");
  dVar1 = (this->super_Abstract<4U>).pr;
  dVar2 = (this->super_Abstract<4U>).cr;
  dVar5 = dVar1 + dVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5;
  uVar7 = vcmpsd_avx512f(auVar21,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar8 = (bool)((byte)uVar7 & 1);
  poVar10 = std::ostream::_M_insert<double>
                      (((dVar1 + dVar1) * dVar2) /
                       (double)((ulong)bVar8 * 0x3ff0000000000000 + (ulong)!bVar8 * (long)dVar5));
  std::operator<<(poVar10,",");
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = Query(it->first);
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->are << ",";
		*outs[1] << this->cr << ",";
		*outs[2] << this->pr << ",";
		*outs[3] << 2 * this->pr * this->cr / ((this->cr + this->pr < 1e-6) ? 1 : this->cr + this->pr) << ",";
	}